

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O2

void __thiscall
uttamarin::App::PrintFooter
          (App *this,int true_lemmas,int false_lemmas,int unknown_lemmas,int overall_duration)

{
  OutputWriter *pOVar1;
  int duration;
  string local_50;
  
  pOVar1 = OutputWriter::operator<<
                     ((this->output_writer_).
                      super___shared_ptr<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      ,"\n");
  pOVar1 = OutputWriter::operator<<(pOVar1,"Summary: ");
  pOVar1 = OutputWriter::operator<<(pOVar1,"\n");
  pOVar1 = OutputWriter::operator<<(pOVar1,"verified: ");
  pOVar1 = OutputWriter::operator<<(pOVar1,true_lemmas);
  pOVar1 = OutputWriter::operator<<(pOVar1,", false: ");
  pOVar1 = OutputWriter::operator<<(pOVar1,false_lemmas);
  pOVar1 = OutputWriter::operator<<(pOVar1,", timeout: ");
  pOVar1 = OutputWriter::operator<<(pOVar1,unknown_lemmas);
  pOVar1 = OutputWriter::operator<<(pOVar1,"\n");
  pOVar1 = OutputWriter::operator<<(pOVar1,"Overall duration: ");
  ToSecondsString_abi_cxx11_(&local_50,(uttamarin *)(ulong)(uint)overall_duration,duration);
  OutputWriter::operator<<(pOVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  OutputWriter::Endl((this->output_writer_).
                     super___shared_ptr<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  return;
}

Assistant:

void App::PrintFooter(int true_lemmas, int false_lemmas,
                      int unknown_lemmas, int overall_duration) {
  *output_writer_ << "\n"
    << "Summary: " << "\n"
    << "verified: " << true_lemmas
    << ", false: " << false_lemmas
    << ", timeout: " << unknown_lemmas
    << "\n"
    << "Overall duration: " << ToSecondsString(overall_duration);
  output_writer_->Endl();
}